

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDriver.cpp
# Opt level: O2

int main(void)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  pointer pvVar7;
  pointer pvVar8;
  pointer pvVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_21;
  initializer_list<int> __l_22;
  initializer_list<int> __l_23;
  initializer_list<int> __l_24;
  initializer_list<int> __l_25;
  initializer_list<int> __l_26;
  initializer_list<int> __l_27;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_28;
  allocator<char> local_4a0;
  allocator<char> local_49f;
  allocator<char> local_49e;
  allocator<char> local_49d;
  allocator_type local_49c;
  allocator<char> local_49b;
  allocator<char> local_49a;
  allocator_type local_499;
  allocator_type local_498;
  allocator_type local_497;
  allocator_type local_496;
  allocator<char> local_495;
  allocator<char> local_494;
  allocator<char> local_493;
  allocator_type local_492;
  allocator<char> local_491;
  allocator<char> local_490;
  allocator<char> local_48f;
  allocator_type local_48e;
  allocator<char> local_48d;
  allocator<char> local_48c;
  allocator<char> local_48b;
  allocator_type local_48a;
  allocator<char> local_489;
  undefined8 local_488;
  Map invalidMap;
  undefined1 local_468 [24];
  vector<int,_std::allocator<int>_> local_450;
  vector<int,_std::allocator<int>_> local_438;
  vector<int,_std::allocator<int>_> local_420;
  vector<int,_std::allocator<int>_> local_408;
  Map validMap;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  invalidCountryData;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  validBorderData;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  invalidBorderData;
  string local_388 [32];
  string local_368 [32];
  undefined1 local_348 [32];
  string local_328 [32];
  string local_308 [32];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  invalidContinentData;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  validCountryData;
  string invalidMapName;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_298;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248 [32];
  string local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8 [32];
  string local_1c8 [32];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  validContinentData;
  string local_190;
  string local_170;
  string validMapName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110 [32];
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0 [32];
  string local_90 [32];
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validMapName,"vTest map",(allocator<char> *)&invalidMap);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalidMap,"europe",(allocator<char> *)&local_208);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_468 + 8),"2",(allocator<char> *)&local_268);
  __l._M_len = 2;
  __l._M_array = (iterator)&invalidMap;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_348,__l,(allocator_type *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalidBorderData,"asia",(allocator<char> *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>
            (local_388,"4",(allocator<char> *)&invalidMapName);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&invalidBorderData;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_348 + 0x18),__l_00,(allocator_type *)&validCountryData);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_348;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&validContinentData,__l_01,(allocator_type *)&validBorderData);
  lVar5 = 0x18;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_348 + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&invalidBorderData.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_468 + lVar5 + -0x18));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalidBorderData,"1",(allocator<char> *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_388,"france",(allocator<char> *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>
            (local_368,"1",(allocator<char> *)&invalidMapName);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&invalidBorderData;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&invalidMap,__l_02,(allocator_type *)&validBorderData);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_348,"2",(allocator<char> *)&validMap);
  std::__cxx11::string::string<std::allocator<char>>
            (local_328,"germany",(allocator<char> *)&invalidContinentData);
  std::__cxx11::string::string<std::allocator<char>>
            (local_308,"1",(allocator<char> *)&invalidCountryData);
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_348;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_468,__l_03,(allocator_type *)&local_488);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"3",&local_4a0);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"russia",&local_49a);
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"2",&local_49b);
  __l_04._M_len = 3;
  __l_04._M_array = &local_208;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_450,__l_04,&local_49c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"4",&local_49d);
  std::__cxx11::string::string<std::allocator<char>>(local_248,"dawd",&local_49e);
  std::__cxx11::string::string<std::allocator<char>>(local_228,"2",&local_49f);
  __l_05._M_len = 3;
  __l_05._M_array = &local_268;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_438,__l_05,&local_498);
  __l_06._M_len = 4;
  __l_06._M_array = (iterator)&invalidMap;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&validCountryData,__l_06,&local_499);
  lVar5 = 0x48;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_468 + lVar5 + -0x18));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_268._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_208._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_348 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&invalidBorderData.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  local_208._M_dataplus._M_p = (pointer)0x200000001;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&local_208;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&invalidMap,__l_07,(allocator_type *)&local_d0);
  invalidBorderData.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_100000002;
  invalidBorderData.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 3;
  __l_08._M_len = 3;
  __l_08._M_array = (iterator)&invalidBorderData;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_468,__l_08,(allocator_type *)&local_130);
  local_348._0_8_ = (pointer)0x200000003;
  local_348._8_4_ = 4;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)local_348;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_450,__l_09,(allocator_type *)&invalidMapName);
  local_268._M_dataplus._M_p = (pointer)0x300000004;
  __l_10._M_len = 2;
  __l_10._M_array = (iterator)&local_268;
  std::vector<int,_std::allocator<int>_>::vector(&local_438,__l_10,(allocator_type *)&validMap);
  __l_11._M_len = 4;
  __l_11._M_array = (iterator)&invalidMap;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&validBorderData,__l_11,(allocator_type *)&invalidContinentData);
  lVar5 = 0x48;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)(local_468 + lVar5 + -0x18));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  std::__cxx11::string::string((string *)&local_170,(string *)&validMapName);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_280,&validContinentData);
  Map::Map(&validMap,&local_170,&local_280);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_280);
  std::__cxx11::string::~string((string *)&local_170);
  for (pvVar7 = validCountryData.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar7 != validCountryData.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pvVar7 = pvVar7 + 1) {
    iVar2 = std::__cxx11::stoi((pvVar7->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start,(size_t *)0x0,10);
    std::__cxx11::string::string
              ((string *)&local_50,
               (string *)
               ((pvVar7->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 1));
    iVar3 = std::__cxx11::stoi((pvVar7->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0,10);
    Map::addNode(&validMap,iVar2,&local_50,iVar3);
    std::__cxx11::string::~string((string *)&local_50);
  }
  for (pvVar8 = validBorderData.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar8 != validBorderData.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pvVar8 = pvVar8 + 1) {
    for (uVar6 = 1;
        piVar1 = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
        uVar6 = (ulong)((int)uVar6 + 1)) {
      Map::addEdge(&validMap,*piVar1,piVar1[uVar6]);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalidMapName,"vTest map",(allocator<char> *)&invalidMap);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalidMap,"europe",(allocator<char> *)&local_208);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_468 + 8),"2",(allocator<char> *)&local_268);
  __l_12._M_len = 2;
  __l_12._M_array = (iterator)&invalidMap;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_348,__l_12,(allocator_type *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalidBorderData,"asia",(allocator<char> *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>
            (local_388,"4",(allocator<char> *)&invalidCountryData);
  __l_13._M_len = 2;
  __l_13._M_array = (iterator)&invalidBorderData;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_348 + 0x18),__l_13,(allocator_type *)&local_488);
  __l_14._M_len = 2;
  __l_14._M_array = (iterator)local_348;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&invalidContinentData,__l_14,(allocator_type *)&local_4a0);
  lVar5 = 0x18;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_348 + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&invalidBorderData.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_468 + lVar5 + -0x18));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalidBorderData,"1",(allocator<char> *)&local_488);
  std::__cxx11::string::string<std::allocator<char>>(local_388,"france",&local_4a0);
  std::__cxx11::string::string<std::allocator<char>>(local_368,"1",&local_49a);
  __l_15._M_len = 3;
  __l_15._M_array = (iterator)&invalidBorderData;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&invalidMap,__l_15,(allocator_type *)&local_49b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_348,"2",(allocator<char> *)&local_49c);
  std::__cxx11::string::string<std::allocator<char>>(local_328,"germany",&local_49d);
  std::__cxx11::string::string<std::allocator<char>>(local_308,"1",&local_49e);
  __l_16._M_len = 3;
  __l_16._M_array = (iterator)local_348;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_468,__l_16,(allocator_type *)&local_49f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"3",(allocator<char> *)&local_498);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e8,"russia",(allocator<char> *)&local_499);
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"2",&local_489);
  __l_17._M_len = 3;
  __l_17._M_array = &local_208;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_450,__l_17,&local_48a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"4",&local_48b);
  std::__cxx11::string::string<std::allocator<char>>(local_248,"kongo",&local_48c);
  std::__cxx11::string::string<std::allocator<char>>(local_228,"1",&local_48d);
  __l_18._M_len = 3;
  __l_18._M_array = &local_268;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_438,__l_18,&local_48e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"5",&local_48f);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"lebanon",&local_490);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"2",&local_491);
  __l_19._M_len = 3;
  __l_19._M_array = &local_d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_420,__l_19,&local_492);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"6",&local_493);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"nepal",&local_494);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"2",&local_495);
  __l_20._M_len = 3;
  __l_20._M_array = &local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_408,__l_20,&local_496);
  __l_21._M_len = 6;
  __l_21._M_array = (iterator)&invalidMap;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&invalidCountryData,__l_21,&local_497);
  lVar5 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_468 + lVar5 + -0x18));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_130._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_d0._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_268._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_208._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_348 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  lVar5 = 0x40;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&invalidBorderData.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  local_348._0_8_ = (pointer)0x200000001;
  __l_22._M_len = 2;
  __l_22._M_array = (iterator)local_348;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&invalidMap,__l_22,(allocator_type *)&local_4a0);
  local_208._M_dataplus._M_p = (pointer)0x300000002;
  __l_23._M_len = 2;
  __l_23._M_array = (iterator)&local_208;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_468,__l_23,(allocator_type *)&local_49a);
  local_268._M_dataplus._M_p = (pointer)0x100000003;
  __l_24._M_len = 2;
  __l_24._M_array = (iterator)&local_268;
  std::vector<int,_std::allocator<int>_>::vector(&local_450,__l_24,(allocator_type *)&local_49b);
  local_d0._M_dataplus._M_p = (pointer)0x500000004;
  __l_25._M_len = 2;
  __l_25._M_array = (iterator)&local_d0;
  std::vector<int,_std::allocator<int>_>::vector(&local_438,__l_25,(allocator_type *)&local_49c);
  local_130._M_dataplus._M_p = (pointer)0x600000005;
  __l_26._M_len = 2;
  __l_26._M_array = (iterator)&local_130;
  std::vector<int,_std::allocator<int>_>::vector(&local_420,__l_26,(allocator_type *)&local_49d);
  local_488 = 0x400000006;
  __l_27._M_len = 2;
  __l_27._M_array = (iterator)&local_488;
  std::vector<int,_std::allocator<int>_>::vector(&local_408,__l_27,(allocator_type *)&local_49e);
  __l_28._M_len = 6;
  __l_28._M_array = (iterator)&invalidMap;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&invalidBorderData,__l_28,(allocator_type *)&local_49f);
  lVar5 = 0x78;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)(local_468 + lVar5 + -0x18));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  std::__cxx11::string::string((string *)&local_190,(string *)&invalidMapName);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&local_298,&invalidContinentData);
  Map::Map(&invalidMap,&local_190,&local_298);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_298);
  std::__cxx11::string::~string((string *)&local_190);
  for (pvVar7 = invalidCountryData.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar7 != invalidCountryData.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pvVar7 = pvVar7 + 1) {
    iVar2 = std::__cxx11::stoi((pvVar7->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start,(size_t *)0x0,10);
    std::__cxx11::string::string
              ((string *)&local_70,
               (string *)
               ((pvVar7->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 1));
    iVar3 = std::__cxx11::stoi((pvVar7->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0,10);
    Map::addNode(&invalidMap,iVar2,&local_70,iVar3);
    std::__cxx11::string::~string((string *)&local_70);
  }
  pvVar8 = (pointer)CONCAT44(invalidBorderData.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                             invalidBorderData.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._0_4_);
  for (pvVar9 = invalidBorderData.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar8; pvVar9 = pvVar9 + 1) {
    for (uVar6 = 1;
        piVar1 = (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
        uVar6 = (ulong)((int)uVar6 + 1)) {
      Map::addEdge(&invalidMap,*piVar1,piVar1[uVar6]);
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing valid map...\n Connected : ");
  Map::testConnected(&validMap);
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing invalid map...\n Connected : ");
  Map::testConnected(&invalidMap);
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::operator<<(poVar4,"\n");
  Map::~Map(&invalidMap);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&invalidBorderData);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&invalidCountryData);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&invalidContinentData);
  std::__cxx11::string::~string((string *)&invalidMapName);
  Map::~Map(&validMap);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&validBorderData);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&validCountryData);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&validContinentData);
  std::__cxx11::string::~string((string *)&validMapName);
  return 0;
}

Assistant:

int main() {
    //more extensive tests are performed in the MapLoader (on the data being submitted)

    //declare valid map information
    std::string validMapName = "vTest map";
    std::vector<std::vector<std::string>> validContinentData = {{"europe", "2"},
                                                                {"asia",   "4"}};
    std::vector<std::vector<std::string>> validCountryData = {{"1", "france",  "1"},
                                                              {"2", "germany", "1"},
                                                              {"3", "russia",  "2"},
                                                              {"4","dawd", "2"}};
    std::vector<std::vector<int>> validBorderData = {{1, 2},
                                                     {2, 1, 3},
                                                     {3, 2, 4},
                                                     {4, 3}};
    //create map object with empty continents
    Map validMap = Map(validMapName, validContinentData);
    //add countries to map and continents
    for (auto& i : validCountryData) {
        validMap.addNode(std::stoi(i[0]), i[1], std::stoi(i[2]));
    }

    //add adjacency
    for (auto& i : validBorderData) {
        for (unsigned int j = 1; j < i.size(); j++) {
            validMap.addEdge(i[0], i[j]);
        }
    }

    //declare invalid map information
    std::string invalidMapName = "vTest map";
    std::vector<std::vector<std::string>> invalidContinentData = {{"europe", "2"},
                                                                  {"asia",   "4"}};
    std::vector<std::vector<std::string>> invalidCountryData = {{"1", "france",  "1"},
                                                                {"2", "germany", "1"},
                                                                {"3", "russia",  "2"},
                                                                {"4", "kongo",  "1"},
                                                                {"5", "lebanon",  "2"},
                                                                {"6", "nepal",  "2"}};
    std::vector<std::vector<int>> invalidBorderData = {{1, 2},
                                                       {2, 3},
                                                       {3, 1},
                                                       {4,5},
                                                       {5,6},
                                                       {6,4}};
    //create map object with empty continents
    Map invalidMap = Map(invalidMapName, invalidContinentData);
    //add countries to map and continents
    for (auto& i : invalidCountryData) {
        invalidMap.addNode(std::stoi(i[0]), i[1], std::stoi(i[2]));
    }

    //add adjacency
    for (auto& i : invalidBorderData) {
        for (unsigned int j = 1; j < i.size(); j++) {
            invalidMap.addEdge(i[0], i[j]);
        }
    }

    //test maps
//    validMap.printMap();
//    invalidMap.printMap();
    std::cout << "Testing valid map...\n Connected : " << validMap.testConnected() << "\n";
    std::cout << "Testing invalid map...\n Connected : " << invalidMap.testConnected() << "\n";
    return 0;
}